

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_corr_to_refl_coef.c
# Opt level: O1

void WebRtcSpl_AutoCorrToReflCoef(int32_t *R,int use_order,int16_t *K)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  ushort uVar8;
  int iVar9;
  short sVar10;
  int iVar11;
  long lVar12;
  ushort uVar13;
  uint uVar14;
  int iVar15;
  short sVar16;
  int iVar17;
  bool bVar18;
  ushort local_88 [16];
  ushort auStack_68 [4];
  int16_t P [14];
  int16_t W [14];
  int16_t ACF [14];
  
  uVar2 = *R;
  if (uVar2 == 0) {
    bVar5 = 0;
  }
  else {
    uVar14 = (int)uVar2 >> 0x1f ^ uVar2;
    bVar4 = (uVar14 < 0x8000) * '\x10';
    bVar5 = bVar4 + 8;
    if (0x7fffff < uVar14 << bVar4) {
      bVar5 = bVar4;
    }
    bVar4 = bVar5 + 4;
    if (0x7ffffff < uVar14 << (bVar5 & 0x1f)) {
      bVar4 = bVar5;
    }
    bVar5 = bVar4 + 2;
    if (0x1fffffff < uVar14 << (bVar4 & 0x1f)) {
      bVar5 = bVar4;
    }
    bVar5 = bVar5 + (uVar14 << (bVar5 & 0x1f) < 0x40000000);
  }
  local_88[0] = (ushort)((uVar2 << (bVar5 & 0x1f)) >> 0x10);
  P[0xc] = local_88[0];
  if (0 < use_order) {
    lVar12 = 0;
    do {
      uVar13 = (ushort)((uint)(R[lVar12 + 1] << (bVar5 & 0x1f)) >> 0x10);
      P[lVar12 + 0xd] = uVar13;
      auStack_68[lVar12 + 1] = uVar13;
      local_88[lVar12 + 1] = uVar13;
      lVar12 = lVar12 + 1;
    } while (use_order != (int)lVar12);
  }
  if (0 < use_order) {
    uVar13 = -local_88[1];
    if (0 < (short)local_88[1]) {
      uVar13 = local_88[1];
    }
    if ((short)local_88[0] < (short)uVar13) {
      iVar3 = 1;
      iVar7 = -1;
    }
    else {
      iVar3 = 1;
      iVar9 = 0;
      iVar6 = use_order;
      do {
        iVar7 = iVar9;
        *K = 0;
        if (local_88[1] != 0) {
          iVar9 = (int)(short)uVar13;
          iVar11 = (int)(short)local_88[0];
          sVar16 = *K;
          iVar17 = -0xf;
          do {
            iVar9 = iVar9 * 2;
            sVar16 = (ushort)(iVar11 <= iVar9) + sVar16 * 2;
            iVar15 = 0;
            if (iVar11 <= iVar9) {
              iVar15 = iVar11;
            }
            iVar9 = iVar9 - iVar15;
            iVar17 = iVar17 + 1;
          } while (iVar17 != 0);
          *K = sVar16;
          if (0 < (short)local_88[1]) {
            *K = -*K;
          }
        }
        if (iVar3 == use_order) {
          return;
        }
        iVar9 = (int)*K;
        sVar16 = (short)((short)local_88[1] * iVar9 + 0x4000U >> 0xf);
        sVar10 = local_88[0] + sVar16;
        bVar18 = SCARRY2(local_88[0],sVar16);
        local_88[0] = local_88[0] + sVar16;
        if (bVar18) {
          local_88[0] = sVar10 >> 0xf ^ 0x8000;
        }
        if (iVar3 < use_order) {
          lVar12 = 1;
          do {
            uVar13 = auStack_68[lVar12];
            uVar1 = local_88[lVar12 + 1];
            sVar16 = (short)((short)uVar1 * iVar9 + 0x4000U >> 0xf);
            uVar8 = sVar16 + uVar13;
            if (SCARRY2(sVar16,uVar13)) {
              uVar8 = (short)(uVar13 + sVar16) >> 0xf ^ 0x8000;
            }
            sVar16 = (short)((short)uVar13 * iVar9 + 0x4000U >> 0xf);
            uVar13 = uVar1 + sVar16;
            if (SCARRY2(uVar1,sVar16)) {
              uVar13 = (short)(uVar1 + sVar16) >> 0xf ^ 0x8000;
            }
            local_88[lVar12] = uVar13;
            auStack_68[lVar12] = uVar8;
            lVar12 = lVar12 + 1;
          } while (iVar6 != (int)lVar12);
        }
        iVar3 = iVar3 + 1;
        K = K + 1;
        uVar13 = -local_88[1];
        if (0 < (short)local_88[1]) {
          uVar13 = local_88[1];
        }
        iVar6 = iVar6 + -1;
        iVar9 = iVar7 + 1;
      } while ((short)uVar13 <= (short)local_88[0]);
      iVar7 = -2 - iVar7;
    }
    if (iVar3 <= use_order) {
      memset(K,0,(ulong)(uint)(iVar7 + use_order) * 2 + 2);
      return;
    }
  }
  return;
}

Assistant:

void WebRtcSpl_AutoCorrToReflCoef(const int32_t *R, int use_order, int16_t *K)
{
    int i, n;
    int16_t tmp;
    const int32_t *rptr;
    int32_t L_num, L_den;
    int16_t *acfptr, *pptr, *wptr, *p1ptr, *w1ptr, ACF[WEBRTC_SPL_MAX_LPC_ORDER],
            P[WEBRTC_SPL_MAX_LPC_ORDER], W[WEBRTC_SPL_MAX_LPC_ORDER];

    // Initialize loop and pointers.
    acfptr = ACF;
    rptr = R;
    pptr = P;
    p1ptr = &P[1];
    w1ptr = &W[1];
    wptr = w1ptr;

    // First loop; n=0. Determine shifting.
    tmp = WebRtcSpl_NormW32(*R);
    *acfptr = (int16_t)((*rptr++ << tmp) >> 16);
    *pptr++ = *acfptr++;

    // Initialize ACF, P and W.
    for (i = 1; i <= use_order; i++)
    {
        *acfptr = (int16_t)((*rptr++ << tmp) >> 16);
        *wptr++ = *acfptr;
        *pptr++ = *acfptr++;
    }

    // Compute reflection coefficients.
    for (n = 1; n <= use_order; n++, K++)
    {
        tmp = WEBRTC_SPL_ABS_W16(*p1ptr);
        if (*P < tmp)
        {
            for (i = n; i <= use_order; i++)
                *K++ = 0;

            return;
        }

        // Division: WebRtcSpl_div(tmp, *P)
        *K = 0;
        if (tmp != 0)
        {
            L_num = tmp;
            L_den = *P;
            i = 15;
            while (i--)
            {
                (*K) <<= 1;
                L_num <<= 1;
                if (L_num >= L_den)
                {
                    L_num -= L_den;
                    (*K)++;
                }
            }
            if (*p1ptr > 0)
                *K = -*K;
        }

        // Last iteration; don't do Schur recursion.
        if (n == use_order)
            return;

        // Schur recursion.
        pptr = P;
        wptr = w1ptr;
        tmp = (int16_t)(((int32_t)*p1ptr * (int32_t)*K + 16384) >> 15);
        *pptr = WebRtcSpl_AddSatW16(*pptr, tmp);
        pptr++;
        for (i = 1; i <= use_order - n; i++)
        {
            tmp = (int16_t)(((int32_t)*wptr * (int32_t)*K + 16384) >> 15);
            *pptr = WebRtcSpl_AddSatW16(*(pptr + 1), tmp);
            pptr++;
            tmp = (int16_t)(((int32_t)*pptr * (int32_t)*K + 16384) >> 15);
            *wptr = WebRtcSpl_AddSatW16(*wptr, tmp);
            wptr++;
        }
    }
}